

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O0

void updtMem2(FOCC_CTA *foccOta,int mTid)

{
  FILE *pFVar1;
  int iVar2;
  tm *ptVar3;
  rep rVar4;
  reference pvVar5;
  result_type_conflict rVar6;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d0;
  duration<long,_std::ratio<1L,_1000L>_> local_c8;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> time_to_commit;
  tm *tinfo;
  time_t exitTime;
  time_point _exitTime;
  time_t local_a0;
  time_t enterTime;
  time_point _enterTime;
  tm *tinfo_1;
  time_t reqTime;
  time_point _reqTime;
  int randVal;
  int randInd;
  int i;
  int locVal;
  int nItr;
  int id;
  time_point start;
  char local_48 [4];
  int curTrans;
  char buf [40];
  int local_18;
  char status;
  int abortCnt;
  int mTid_local;
  FOCC_CTA *foccOta_local;
  
  buf[0x27] = 'a';
  for (start.__d.__r._4_4_ = 0; start.__d.__r._4_4_ < glb::numTrans;
      start.__d.__r._4_4_ = start.__d.__r._4_4_ + 1) {
    local_18 = 0;
    _nItr = (duration)std::chrono::_V2::system_clock::now();
    do {
      locVal = FOCC_CTA::begin_trans(foccOta);
      iVar2 = rand();
      i = iVar2 % glb::M + 1;
      for (randVal = 0; randVal < i; randVal = randVal + 1) {
        iVar2 = rand();
        _reqTime.__d.__r._4_4_ = iVar2 % glb::M;
        iVar2 = rand();
        _reqTime.__d.__r._0_4_ = iVar2 % glb::constVal;
        FOCC_CTA::read(foccOta,locVal,(void *)(ulong)_reqTime.__d.__r._4_4_,(size_t)&randInd);
        reqTime = std::chrono::_V2::system_clock::now();
        tinfo_1 = (tm *)std::chrono::_V2::system_clock::to_time_t((time_point *)&reqTime);
        ptVar3 = localtime((time_t *)&tinfo_1);
        strftime(local_48,0x28,"%H:%M:%S",ptVar3);
        pFVar1 = glb::log_file;
        _enterTime.__d.__r = (duration)std::this_thread::get_id();
        fprintf(pFVar1,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n",
                _enterTime.__d.__r,(ulong)(uint)locVal,(ulong)_reqTime.__d.__r._4_4_,
                (ulong)(uint)randInd,local_48);
        randInd = randInd + (int)_reqTime.__d.__r;
        FOCC_CTA::write(foccOta,locVal,(void *)(ulong)_reqTime.__d.__r._4_4_,(ulong)(uint)randInd);
        enterTime = std::chrono::_V2::system_clock::now();
        local_a0 = std::chrono::_V2::system_clock::to_time_t((time_point *)&enterTime);
        ptVar3 = localtime(&local_a0);
        strftime(local_48,0x28,"%H:%M:%S",ptVar3);
        pFVar1 = glb::log_file;
        _exitTime.__d.__r = (duration)std::this_thread::get_id();
        fprintf(pFVar1,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n",
                _exitTime.__d.__r,(ulong)(uint)locVal,(ulong)_reqTime.__d.__r._4_4_,
                (ulong)(uint)randInd,local_48);
        rVar6 = std::exponential_distribution<double>::operator()
                          ((exponential_distribution<double> *)&glb::dist,
                           (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                           &glb::generator);
        usleep((__useconds_t)(long)(rVar6 * 1000.0));
      }
      buf[0x27] = FOCC_CTA::tryC(foccOta,locVal);
      exitTime = std::chrono::_V2::system_clock::now();
      tinfo = (tm *)std::chrono::_V2::system_clock::to_time_t((time_point *)&exitTime);
      time_to_commit.__r = (rep)localtime((time_t *)&tinfo);
      strftime(local_48,0x28,"%H:%M:%S",(tm *)time_to_commit.__r);
      fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n",
              (ulong)(uint)locVal,(ulong)(uint)(int)buf[0x27],local_48);
      if (buf[0x27] == 'a') {
        local_18 = local_18 + 1;
      }
    } while (buf[0x27] != 'c');
    local_d8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_d0.__r = (rep)std::chrono::operator-
                                  (&local_d8,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&nItr);
    local_c8.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_d0);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_c8);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay,
                        (long)mTid);
    *pvVar5 = rVar4 + *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts,
                        (long)mTid);
    *pvVar5 = (long)local_18 + *pvVar5;
  }
  return;
}

Assistant:

void updtMem2(FOCC_CTA* foccOta, int mTid){
    int abortCnt = 0;
    char status = glb::TRANS_ABORT;

    char buf[40];
    // each thread invokes numTrans Transactions!
    for(int curTrans=0; curTrans<glb::numTrans; curTrans++){
        abortCnt = 0;
        auto start = high_resolution_clock::now();
        do {
            int id = foccOta->begin_trans();
            int nItr = rand()%glb::M + 1;

            int locVal;

            for(int i=0; i<nItr; i++){
                // rnadom index to be updated.
                int randInd = rand()%glb::M;
                int randVal = rand()%glb::constVal;

                foccOta->read(id, randInd, &locVal);

                auto _reqTime = std::chrono::system_clock::now();
                time_t reqTime = std::chrono::system_clock::to_time_t(_reqTime);
                struct tm* tinfo= localtime(&reqTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
                fprintf(glb::log_file,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                locVal+=randVal;

                foccOta->write(id, randInd, locVal);

                auto _enterTime = std::chrono::system_clock::now(); //the timepoint
                auto enterTime = std::chrono::system_clock::to_time_t(_enterTime);
                tinfo= localtime(&enterTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);

                fprintf(glb::log_file,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                usleep(1000*glb::dist(glb::generator));
            }

            status = foccOta->tryC(id);

            auto _exitTime = std::chrono::system_clock::now(); //the timepoint
            auto exitTime = std::chrono::system_clock::to_time_t(_exitTime);
            struct tm* tinfo= localtime(&exitTime);
            strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
            fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n", id, status, buf);
            //fprintf(stdout,"Transaction %d tryCommits with result %c\n", id, status);

            if(status == glb::TRANS_ABORT) {abortCnt++;}

        } while(status!=glb::TRANS_COMMIT);

        auto time_to_commit = duration_cast<milliseconds>(high_resolution_clock::now() - start);
        glb::total_delay[mTid]+=time_to_commit.count();
        glb::total_aborts[mTid]+=abortCnt;
    } // for
}